

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_client.cc
# Opt level: O3

Packet * __thiscall
iqxmlrpc::Https_proxy_client_connection::do_process_session
          (Https_proxy_client_connection *this,string *s)

{
  Packet *pPVar1;
  Https_client_connection https_conn;
  Https_client_connection local_140;
  
  setup_tunnel(this);
  Https_client_connection::Https_client_connection
            (&local_140,&(this->super_Connection).sock,this->non_blocking);
  local_140.super_Reaction_connection.reactor = local_140.reactor._M_ptr;
  iqnet::ssl::Reaction_connection::post_connect(&local_140.super_Reaction_connection);
  pPVar1 = Https_client_connection::do_process_session(&local_140,s);
  local_140.super_Client_connection._vptr_Client_connection =
       (_func_int **)&PTR__Https_client_connection_00189cc0;
  local_140.super_Reaction_connection.super_Connection.super_Connection.super_Event_handler.
  _vptr_Event_handler = (_func_int **)&PTR__Https_client_connection_00189d10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.out_str._M_dataplus._M_p != &local_140.out_str.field_2) {
    operator_delete(local_140.out_str._M_dataplus._M_p,
                    local_140.out_str.field_2._M_allocated_capacity + 1);
  }
  if (local_140.reactor._M_ptr != (Reactor_base *)0x0) {
    (*(local_140.reactor._M_ptr)->_vptr_Reactor_base[1])();
  }
  iqnet::ssl::Connection::~Connection(&local_140.super_Reaction_connection.super_Connection);
  Client_connection::~Client_connection(&local_140.super_Client_connection);
  return pPVar1;
}

Assistant:

http::Packet* Https_proxy_client_connection::do_process_session( const std::string& s )
{
  setup_tunnel();

  Https_client_connection https_conn(sock, non_blocking);
  https_conn.post_connect();

  return https_conn.do_process_session(s);
}